

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::stringify<(anonymous_namespace)::Emplaceable*>
          (string *__return_storage_ptr__,Detail *this,Emplaceable **e)

{
  size_t in_RCX;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)this;
  if (local_10 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nullptr",&local_11);
  }
  else {
    rawMemoryToString_abi_cxx11_(__return_storage_ptr__,(Detail *)&local_10,(void *)0x8,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<std::remove_cv_t<std::remove_reference_t<T>>>::convert(e);
        }